

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwinprops.cpp
# Opt level: O2

void testwin3(wins *wins_ar,int ar_len)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  Am_Style aAStack_38 [8];
  
  uVar5 = 0;
  uVar4 = (ulong)(uint)ar_len;
  if (ar_len < 1) {
    uVar4 = uVar5;
  }
  uVar4 = uVar4 * 0x40;
  for (; uVar4 != uVar5; uVar5 = uVar5 + 0x40) {
    puVar1 = *(undefined8 **)((long)&wins_ar->root + uVar5);
    Am_Style::Am_Style(aAStack_38,(Am_Style *)&red);
    uVar3 = (**(code **)*puVar1)
                      (puVar1,10,0x32,200,200,"D3","D3 Icon",1,1,aAStack_38,0,1,1,0,0,1,0,0,1,0);
    Am_Style::~Am_Style(aAStack_38);
    *(undefined8 *)((long)&wins_ar->d3 + uVar5) = uVar3;
  }
  printf("Hit RETURN to de-iconify red window:");
  getchar();
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 0x40) {
    plVar2 = *(long **)((long)&wins_ar->d3 + uVar5);
    (**(code **)(*plVar2 + 0x38))(plVar2,0);
  }
  printf("Hit RETURN to re-iconify red window:");
  getchar();
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 0x40) {
    plVar2 = *(long **)((long)&wins_ar->d3 + uVar5);
    (**(code **)(*plVar2 + 0x38))(plVar2,1);
  }
  return;
}

Assistant:

void
testwin3(wins *wins_ar, int ar_len)
{
  //printf("Hit RETURN to bring up iconified window:");
  //getchar();

  int i;
  for (i = 0; i < ar_len; i++) {
    Am_Drawonable *the_d3 =
        (wins_ar[i].root)
            ->Create(10, 50, 200, 200, "D3", "D3 Icon", true, true, red);
    wins_ar[i].d3 = the_d3;
  }

  printf("Hit RETURN to de-iconify red window:");
  getchar();

  for (i = 0; i < ar_len; i++) {
    (wins_ar[i].d3)->Set_Iconify(false);
  }

  printf("Hit RETURN to re-iconify red window:");
  getchar();

  for (i = 0; i < ar_len; i++) {
    (wins_ar[i].d3)->Set_Iconify(true);
  }
}